

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  unsigned_short uVar1;
  ImWchar IVar2;
  int iVar3;
  uint i_00;
  ImFontGlyph *pIVar4;
  float *pfVar5;
  unsigned_short *puVar6;
  ImFontGlyph *__src;
  ImFont *in_RDI;
  int i_2;
  ImWchar fallback_chars [3];
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ImFontGlyph *tab_glyph;
  int page_n;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  float fVar7;
  float in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa8;
  unsigned_short in_stack_ffffffffffffffaa;
  float in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb2;
  int in_stack_ffffffffffffffb4;
  int local_3c;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 != (in_RDI->Glyphs).Size; local_10 = local_10 + 1) {
    pIVar4 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_10);
    iVar3 = ImMax<int>(local_c,*(uint *)pIVar4 >> 2);
    in_stack_ffffffffffffffb4 = local_c;
    local_c = iVar3;
  }
  ImVector<float>::clear
            ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  ImVector<unsigned_short>::clear
            ((ImVector<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  in_RDI->DirtyLookupTables = false;
  memset(in_RDI->Used4kPagesMap,0,2);
  GrowIndex((ImFont *)
            CONCAT44(in_stack_ffffffffffffffb4,
                     CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)),
            (int)in_stack_ffffffffffffffac);
  for (local_14 = 0; local_14 < (in_RDI->Glyphs).Size; local_14 = local_14 + 1) {
    pIVar4 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_14);
    i_00 = *(uint *)pIVar4 >> 2;
    pIVar4 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_14);
    in_stack_ffffffffffffffac = pIVar4->AdvanceX;
    pfVar5 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,i_00);
    *pfVar5 = in_stack_ffffffffffffffac;
    uVar1 = (unsigned_short)local_14;
    puVar6 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,i_00);
    *puVar6 = uVar1;
    iVar3 = (int)(i_00 / 0x1000) >> 3;
    in_RDI->Used4kPagesMap[iVar3] =
         in_RDI->Used4kPagesMap[iVar3] | (byte)(1 << ((byte)(i_00 / 0x1000) & 7));
  }
  pIVar4 = FindGlyph(in_RDI,0x20);
  if (pIVar4 != (ImFontGlyph *)0x0) {
    pIVar4 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
    if (*(uint *)pIVar4 >> 2 != 9) {
      ImVector<ImFontGlyph>::resize
                ((ImVector<ImFontGlyph> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    }
    pIVar4 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
    __src = FindGlyph(in_RDI,0x20);
    memcpy(pIVar4,__src,0x28);
    *(uint *)pIVar4 = *(uint *)pIVar4 & 3 | 0x24;
    pIVar4->AdvanceX = pIVar4->AdvanceX * 4.0;
    in_stack_ffffffffffffffa4 = pIVar4->AdvanceX;
    pfVar5 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,*(uint *)pIVar4 >> 2);
    *pfVar5 = in_stack_ffffffffffffffa4;
    in_stack_ffffffffffffffaa = (short)(in_RDI->Glyphs).Size - 1;
    puVar6 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,*(uint *)pIVar4 >> 2);
    *puVar6 = in_stack_ffffffffffffffaa;
  }
  SetGlyphVisible((ImFont *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  (ImWchar)((uint)in_stack_ffffffffffffff9c >> 0x10),
                  SUB41((uint)in_stack_ffffffffffffff9c >> 8,0));
  SetGlyphVisible((ImFont *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  (ImWchar)((uint)in_stack_ffffffffffffff9c >> 0x10),
                  SUB41((uint)in_stack_ffffffffffffff9c >> 8,0));
  if (in_RDI->EllipsisChar == 0xffff) {
    IVar2 = FindFirstExistingGlyph
                      ((ImFont *)
                       CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)),
                       (ImWchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    in_RDI->EllipsisChar = IVar2;
  }
  if (in_RDI->DotChar == 0xffff) {
    IVar2 = FindFirstExistingGlyph
                      ((ImFont *)
                       CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)),
                       (ImWchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    in_RDI->DotChar = IVar2;
  }
  pIVar4 = FindGlyphNoFallback(in_RDI,in_RDI->FallbackChar);
  in_RDI->FallbackGlyph = pIVar4;
  if (in_RDI->FallbackGlyph == (ImFontGlyph *)0x0) {
    IVar2 = FindFirstExistingGlyph
                      ((ImFont *)
                       CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)),
                       (ImWchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    in_RDI->FallbackChar = IVar2;
    pIVar4 = FindGlyphNoFallback(in_RDI,in_RDI->FallbackChar);
    in_RDI->FallbackGlyph = pIVar4;
    if (in_RDI->FallbackGlyph == (ImFontGlyph *)0x0) {
      pIVar4 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
      in_RDI->FallbackGlyph = pIVar4;
      in_RDI->FallbackChar = (ImWchar)(*(uint *)in_RDI->FallbackGlyph >> 2);
    }
  }
  in_RDI->FallbackAdvanceX = in_RDI->FallbackGlyph->AdvanceX;
  for (local_3c = 0; local_3c < local_c + 1; local_3c = local_3c + 1) {
    pfVar5 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,local_3c);
    if (*pfVar5 <= 0.0 && *pfVar5 != 0.0) {
      fVar7 = in_RDI->FallbackAdvanceX;
      pfVar5 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,local_3c);
      *pfVar5 = fVar7;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}